

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::RepeatedPtrFieldTest_MutableDataIsMutable_Test::
~RepeatedPtrFieldTest_MutableDataIsMutable_Test
          (RepeatedPtrFieldTest_MutableDataIsMutable_Test *this)

{
  RepeatedPtrFieldTest_MutableDataIsMutable_Test *this_local;
  
  ~RepeatedPtrFieldTest_MutableDataIsMutable_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(RepeatedPtrFieldTest, MutableDataIsMutable) {
  RepeatedPtrField<std::string> field;
  *field.Add() = "1";
  EXPECT_EQ("1", field.Get(0));
  // The fact that this line compiles would be enough, but we'll check the
  // value anyway.
  std::string** data = field.mutable_data();
  **data = "2";
  EXPECT_EQ("2", field.Get(0));
}